

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# calculator02buggy.cpp
# Opt level: O3

double factorial(double d)

{
  runtime_error *this;
  uint uVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  double dVar6;
  uint uVar7;
  uint uVar8;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  undefined1 auVar9 [16];
  uint uVar14;
  int iVar15;
  uint uVar16;
  int iVar17;
  uint uVar18;
  int iVar19;
  uint uVar20;
  uint uVar21;
  undefined1 *local_38 [2];
  undefined1 local_28 [16];
  
  dVar6 = (double)(int)d;
  if ((dVar6 == d) && (!NAN(dVar6) && !NAN(d))) {
    uVar1 = (uint)d;
    if (uVar1 == 0) {
      dVar6 = 1.0;
    }
    else if (2 < (int)uVar1) {
      uVar14 = uVar1 + 1;
      iVar15 = uVar1 - 1;
      iVar17 = uVar1 - 2;
      iVar19 = uVar1 - 3;
      uVar2 = uVar1 - 3;
      iVar3 = 4;
      uVar8 = uVar1;
      uVar20 = 1;
      uVar12 = 1;
      uVar21 = 1;
      do {
        uVar13 = uVar21;
        uVar11 = uVar12;
        uVar10 = uVar20;
        uVar7 = uVar8;
        auVar9._0_4_ = uVar1 - 1;
        auVar9._4_4_ = iVar15 + -1;
        auVar9._8_4_ = iVar17 + -1;
        auVar9._12_4_ = iVar19 + -1;
        uVar8 = auVar9._0_4_ * uVar7;
        uVar12 = (uint)((auVar9._8_8_ & 0xffffffff) * (ulong)uVar11);
        uVar20 = uVar10 * auVar9._4_4_;
        uVar21 = uVar13 * auVar9._12_4_;
        uVar1 = uVar1 - 4;
        iVar15 = iVar15 + -4;
        iVar17 = iVar17 + -4;
        iVar19 = iVar19 + -4;
        iVar4 = iVar3 + -4;
        iVar5 = iVar3 + (uVar14 & 0xfffffffc);
        iVar3 = iVar4;
      } while (iVar5 != 8);
      uVar1 = -iVar4;
      uVar14 = -(uint)((int)(uVar2 ^ 0x80000000) < (int)(uVar1 ^ 0x80000000));
      uVar16 = -(uint)((int)(uVar2 ^ 0x80000000) < (int)((uVar1 | 1) ^ 0x80000000));
      uVar18 = -(uint)((int)(uVar2 ^ 0x80000000) < (int)((uVar1 | 2) ^ 0x80000000));
      uVar1 = -(uint)((int)(uVar2 ^ 0x80000000) < (int)((uVar1 | 3) ^ 0x80000000));
      dVar6 = (double)(int)((~uVar18 & uVar12 | uVar11 & uVar18) *
                            (~uVar14 & uVar8 | uVar7 & uVar14) *
                           (~uVar16 & uVar20 | uVar10 & uVar16) * (~uVar1 & uVar21 | uVar13 & uVar1)
                           );
    }
    return dVar6;
  }
  local_38[0] = local_28;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_38,"\'!\' could be used only on integers","");
  this = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this,(string *)local_38);
  __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

double factorial(double d)
{
	auto i = static_cast<int32_t>(d);
	if (i != d)
		error("'!' could be used only on integers");
	if (i == 0)
		return 1.0; // factorial of 0 is 1
	for (auto j = (i - 1); j > 1; --j)
		i *= j;
	return static_cast<double>(i);
}